

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csv_cursor.hpp
# Opt level: O0

void __thiscall
jsoncons::csv::basic_csv_cursor<char,jsoncons::stream_source<char>,std::allocator<char>>::
basic_csv_cursor<std::__cxx11::istringstream&>(void *param_1)

{
  byte bVar1;
  basic_staj_visitor<char> *this;
  undefined8 in_R9;
  allocator<char> *in_stack_00000208;
  function<bool_(jsoncons::csv::csv_errc,_const_jsoncons::ser_context_&)> *in_stack_00000210;
  basic_csv_decode_options<char> *in_stack_00000218;
  basic_csv_parser<char,_std::allocator<char>_> *in_stack_00000220;
  basic_istringstream<char,_std::char_traits<char>,_std::allocator<char>_>
  *in_stack_ffffffffffffff58;
  undefined7 in_stack_ffffffffffffff60;
  undefined1 in_stack_ffffffffffffff67;
  function<bool_(jsoncons::csv::csv_errc,_const_jsoncons::ser_context_&)> *in_stack_ffffffffffffff68
  ;
  
  ser_context::ser_context((ser_context *)((long)param_1 + 0x408));
  basic_staj_cursor<char>::basic_staj_cursor((basic_staj_cursor<char> *)param_1);
  *(undefined8 *)param_1 = 0x1339918;
  *(undefined8 *)((long)param_1 + 0x408) = 0x13399b8;
  text_source_adaptor<jsoncons::stream_source<char>>::
  text_source_adaptor<std::__cxx11::istringstream&>
            ((text_source_adaptor<jsoncons::stream_source<char>_> *)
             CONCAT17(in_stack_ffffffffffffff67,in_stack_ffffffffffffff60),in_stack_ffffffffffffff58
            );
  this = (basic_staj_visitor<char> *)((long)param_1 + 0x1a8);
  std::function<bool_(jsoncons::csv::csv_errc,_const_jsoncons::ser_context_&)>::function
            ((function<bool_(jsoncons::csv::csv_errc,_const_jsoncons::ser_context_&)> *)this,
             in_stack_ffffffffffffff68);
  basic_csv_parser<char,_std::allocator<char>_>::basic_csv_parser
            (in_stack_00000220,in_stack_00000218,in_stack_00000210,in_stack_00000208);
  std::function<bool_(jsoncons::csv::csv_errc,_const_jsoncons::ser_context_&)>::~function
            ((function<bool_(jsoncons::csv::csv_errc,_const_jsoncons::ser_context_&)> *)0x44014c);
  basic_staj_visitor<char>::basic_staj_visitor(this);
  basic_csv_parser<char,_std::allocator<char>_>::cursor_mode
            ((basic_csv_parser<char,_std::allocator<char>_> *)((long)param_1 + 0x1a8),true);
  bVar1 = (**(code **)(*param_1 + 0x18))();
  if ((bVar1 & 1) == 0) {
    (**(code **)(*param_1 + 0x40))(param_1,in_R9);
  }
  return;
}

Assistant:

basic_csv_cursor(std::allocator_arg_t, const Allocator& alloc, 
        Sourceable&& source, 
        const basic_csv_decode_options<CharT>& options,
        std::function<bool(csv_errc,const ser_context&)> err_handler,
        std::error_code& ec,
        typename std::enable_if<!std::is_constructible<jsoncons::basic_string_view<CharT>,Sourceable>::value>::type* = 0)
       : source_(std::forward<Sourceable>(source)),
         parser_(options,err_handler,alloc)
    {
        parser_.cursor_mode(true);
        if (!done())
        {
            next(ec);
        }
    }